

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

void __thiscall
sjtu::TrainManager::query_transfer_cmp<sjtu::cmp_cost>
          (TrainManager *this,long *station,timeType *date)

{
  uint uVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar2;
  bool bVar3;
  undefined8 uVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  pair<unsigned_int,_bool> pVar10;
  pair<unsigned_int,_bool> pVar11;
  long *plVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  char *__s;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  locType offset;
  pair<sjtu::recordType,_sjtu::recordType> ans;
  uint bits [3] [512];
  timeType local_1b38;
  long local_1b28;
  int local_1b1c;
  timeType *local_1b18;
  long *local_1b10;
  long local_1b08;
  long local_1b00 [2];
  string local_1af0;
  ulong local_1ad0;
  recordType *local_1ac8;
  long *local_1ac0;
  long *local_1ab8;
  long local_1ab0;
  long local_1aa8 [2];
  long *local_1a98;
  long local_1a90;
  long local_1a88 [2];
  undefined1 local_1a78 [64];
  undefined1 local_1a38 [8];
  char *local_1a30;
  ulong local_1a18;
  int iStack_1a10;
  int iStack_1a0c;
  ulong local_1a08 [2];
  undefined8 local_19f8;
  int local_19f0;
  undefined1 local_19e8 [64];
  string local_19a8 [32];
  ulong local_1988;
  int iStack_1980;
  int iStack_197c;
  int local_1968 [4];
  pair<sjtu::recordType,_sjtu::recordType> local_1958;
  ulong local_1838 [256];
  uint local_1038 [512];
  uint local_838 [514];
  trainType *ptVar13;
  
  pBVar2 = this->StationBpTree;
  local_1b18 = date;
  local_1a98 = local_1a88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1a98,*station,station[1] + *station);
  if (local_1a90 == 0) {
    local_1838[0] = 0;
  }
  else {
    lVar20 = 0;
    lVar16 = 0;
    local_1838[0] = 0;
    do {
      uVar22 = (ulong)((int)*(char *)((long)local_1a98 + lVar20) + 0x100);
      lVar16 = (long)(lVar16 * 0x239 + uVar22) % 0x3b800001;
      local_1838[0] = (long)(local_1838[0] * 0x301 + uVar22) % 0x3b9aca07;
      lVar20 = lVar20 + 1;
    } while (local_1a90 != lVar20);
    local_1838[0] = lVar16 << 0x20 | local_1838[0];
  }
  pVar10 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar2,local_1838);
  if (local_1a98 != local_1a88) {
    operator_delete(local_1a98,local_1a88[0] + 1);
  }
  pBVar2 = this->StationBpTree;
  local_1ab8 = local_1aa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1ab8,station[4],station[5] + station[4]);
  if (local_1ab0 == 0) {
    local_1838[0] = 0;
  }
  else {
    lVar20 = 0;
    lVar16 = 0;
    local_1838[0] = 0;
    do {
      uVar22 = (ulong)((int)*(char *)((long)local_1ab8 + lVar20) + 0x100);
      lVar16 = (long)(lVar16 * 0x239 + uVar22) % 0x3b800001;
      local_1838[0] = (long)(local_1838[0] * 0x301 + uVar22) % 0x3b9aca07;
      lVar20 = lVar20 + 1;
    } while (local_1ab0 != lVar20);
    local_1838[0] = lVar16 << 0x20 | local_1838[0];
  }
  pVar11 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                     (pBVar2,local_1838);
  if (local_1ab8 != local_1aa8) {
    operator_delete(local_1ab8,local_1aa8[0] + 1);
  }
  if (((ulong)pVar11 >> 0x20 & 1) == 0 || ((ulong)pVar10 >> 0x20 & 1) == 0) {
    plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
  }
  else {
    local_1ac0 = station + 4;
    bitset_query(this,pVar10.first,(uint *)local_1838);
    bitset_query(this,pVar11.first,local_1038);
    std::pair<sjtu::recordType,_sjtu::recordType>::pair<sjtu::recordType,_sjtu::recordType,_true>
              (&local_1958);
    local_1ac8 = &local_1958.second;
    lVar16 = 0;
    bVar3 = false;
    do {
      uVar18 = *(uint *)((long)local_1838 + lVar16 * 4);
      if (uVar18 != 0) {
        local_1b1c = (int)lVar16 * 0x20 + 1;
        do {
          uVar19 = -uVar18 & uVar18;
          if (uVar19 != 0) {
            iVar8 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
              }
            }
            local_1b28 = (long)(iVar8 + local_1b1c) * 0xa7a8;
            iVar8 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                      _vptr_FileManager_Base[2])(this->TrainFile,&local_1b28);
            ptVar13 = (trainType *)CONCAT44(extraout_var,iVar8);
            iVar8 = timeType::dateminus(local_1b18,ptVar13->saleDate);
            local_1af0._M_dataplus._M_p = (pointer)&local_1af0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1af0,*station,station[1] + *station);
            iVar9 = trainType::get_Delta_date(ptVar13,&local_1af0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
              operator_delete(local_1af0._M_dataplus._M_p,
                              local_1af0.field_2._M_allocated_capacity + 1);
            }
            uVar18 = iVar9 + iVar8;
            if ((-1 < (int)uVar18 && ptVar13->is_released != false) &&
               (iVar8 = timeType::dateminus(ptVar13->saleDate + 1,ptVar13->saleDate),
               (int)uVar18 <= iVar8)) {
              std::pair<sjtu::recordType,_sjtu::recordType>::
              pair<sjtu::recordType,_sjtu::recordType,_true>
                        ((pair<sjtu::recordType,_sjtu::recordType> *)local_1a78);
              uVar4 = local_1a78._8_8_;
              strlen((char *)ptVar13);
              std::__cxx11::string::_M_replace((ulong)local_1a78,0,(char *)uVar4,(ulong)ptVar13);
              std::__cxx11::string::_M_assign((string *)(local_1a78 + 0x20));
              local_1a08[0]._0_4_ = (ptVar13->startTime).month;
              local_1a08[0]._4_4_ = (ptVar13->startTime).day;
              local_1a08[1]._0_4_ = (ptVar13->startTime).hour;
              local_1a08[1]._4_4_ = (ptVar13->startTime).minute;
              local_1a18._0_4_ = (ptVar13->startTime).month;
              local_1a18._4_4_ = (ptVar13->startTime).day;
              iStack_1a10 = (ptVar13->startTime).hour;
              iStack_1a0c = (ptVar13->startTime).minute;
              local_19f8._0_4_ = 0;
              local_19f8._4_4_ = 100000;
              local_19f0 = 0;
              if (0 < ptVar13->stationNum) {
                local_1ad0 = (ulong)uVar18;
                lVar20 = 0;
                bVar7 = false;
                do {
                  iVar8 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                            _vptr_FileManager_Base[2])();
                  if (lVar20 != 0) {
                    timeType::operator+(&local_1b38,(int *)local_1a08);
                    local_1a08[0]._0_4_ = local_1b38.month;
                    local_1a08[0]._4_4_ = local_1b38.day;
                    local_1a08[1]._0_4_ = local_1b38.hour;
                    local_1a08[1]._4_4_ = local_1b38.minute;
                    local_19f0 = local_19f0 +
                                 (uint)bVar7 *
                                 *(int *)(CONCAT44(extraout_var_00,iVar8) + lVar20 * 0x1a8 + 0x1c4);
                  }
                  pcVar5 = local_1a30;
                  if (bVar7) {
                    lVar17 = CONCAT44(extraout_var_00,iVar8) + lVar20 * 0x1a8;
                    __s = (char *)(lVar17 + 0x20);
                    strlen(__s);
                    std::__cxx11::string::_M_replace((ulong)local_1a38,0,pcVar5,(ulong)__s);
                    iVar8 = *(int *)(lVar17 + 0x4c + local_1ad0 * 4);
                    if (local_19f8._4_4_ < iVar8) {
                      iVar8 = local_19f8._4_4_;
                    }
                    local_19f8._4_4_ = iVar8;
                    local_19f8._0_4_ = (int)local_19f8 + *(int *)(lVar17 + 0x1bc);
                    pBVar2 = this->StationBpTree;
                    local_1b10 = local_1b00;
                    sVar14 = strlen(__s);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_1b10,__s,__s + sVar14);
                    if (local_1b08 == 0) {
                      local_1b38._0_8_ = 0;
                    }
                    else {
                      lVar21 = 0;
                      lVar17 = 0;
                      local_1b38._0_8_ = 0;
                      do {
                        uVar22 = (ulong)((int)*(char *)((long)local_1b10 + lVar21) + 0x100);
                        lVar17 = (long)(lVar17 * 0x239 + uVar22) % 0x3b800001;
                        local_1b38._0_8_ = (long)(local_1b38._0_8_ * 0x301 + uVar22) % 0x3b9aca07;
                        lVar21 = lVar21 + 1;
                      } while (local_1b08 != lVar21);
                      local_1b38._0_8_ = lVar17 << 0x20 | local_1b38._0_8_;
                    }
                    pVar10 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                             ::find(pBVar2,(unsigned_long_long *)&local_1b38);
                    bitset_query(this,pVar10.first,local_838);
                    if (local_1b10 != local_1b00) {
                      operator_delete(local_1b10,local_1b00[0] + 1);
                    }
                    lVar17 = 0;
                    do {
                      uVar18 = local_838[lVar17] & local_1038[lVar17];
                      local_838[lVar17] = uVar18;
                      if (uVar18 != 0) {
                        do {
                          uVar23 = -uVar18 & uVar18;
                          if (uVar23 != 0) {
                            iVar8 = 0;
                            if (uVar18 != 0) {
                              for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                              }
                            }
                            local_1b38._0_8_ = (long)(iVar8 + (int)lVar17 * 0x20 + 1) * 0xa7a8;
                            iVar8 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                                      _vptr_FileManager_Base[2])(this->TrainFile,&local_1b38);
                            ptVar13 = (trainType *)CONCAT44(extraout_var_01,iVar8);
                            iVar8 = std::__cxx11::string::compare((char *)local_1a78);
                            if (iVar8 != 0) {
                              std::__cxx11::string::_M_assign((string *)(local_19e8 + 0x20));
                              std::__cxx11::string::_M_assign(local_19a8);
                              uVar4 = local_19e8._8_8_;
                              strlen((char *)ptVar13);
                              std::__cxx11::string::_M_replace
                                        ((ulong)local_19e8,0,(char *)uVar4,(ulong)ptVar13);
                              local_1988 = local_1a08[0];
                              iStack_1980 = (int)local_1a08[1];
                              iStack_197c = local_1a08[1]._4_4_;
                              bVar6 = trainType::getrecord(ptVar13,(recordType *)local_19e8,true);
                              if (bVar6) {
                                if (bVar3) {
                                  if ((local_1958.second.price + local_1958.first.price <=
                                       local_1968[0] + (int)local_19f8) &&
                                     ((local_1968[0] + (int)local_19f8 !=
                                       local_1958.second.price + local_1958.first.price ||
                                      (local_1958.first.duration <= local_19f0))))
                                  goto LAB_0011189d;
                                }
                                recordType::operator=(&local_1958.first,(recordType *)local_1a78);
                                bVar3 = true;
                                recordType::operator=(local_1ac8,(recordType *)local_19e8);
                              }
                            }
                          }
LAB_0011189d:
                          uVar1 = local_838[lVar17];
                          uVar18 = uVar1 ^ uVar23;
                          local_838[lVar17] = uVar18;
                        } while (uVar1 != uVar23);
                      }
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 0x200);
                  }
                  iVar8 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                            _vptr_FileManager_Base[2])(this->TrainFile,&local_1b28);
                  if (lVar20 != 0) {
                    timeType::operator+(&local_1b38,(int *)local_1a08);
                    local_1a08[0]._0_4_ = local_1b38.month;
                    local_1a08[0]._4_4_ = local_1b38.day;
                    local_1a08[1]._0_4_ = local_1b38.hour;
                    local_1a08[1]._4_4_ = local_1b38.minute;
                    local_19f0 = local_19f0 +
                                 (uint)bVar7 *
                                 *(int *)(CONCAT44(extraout_var_02,iVar8) + lVar20 * 0x1a8 + 0x1c0);
                  }
                  iVar9 = std::__cxx11::string::compare((char *)station);
                  if (iVar9 == 0) {
                    local_1a08[0]._0_4_ = local_1b18->month;
                    local_1a08[0]._4_4_ = local_1b18->day;
                    local_1a18 = local_1a08[0];
                    iStack_1a10 = (int)local_1a08[1];
                    iStack_1a0c = local_1a08[1]._4_4_;
                    bVar7 = true;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 < *(int *)(CONCAT44(extraout_var_02,iVar8) + 0x18));
              }
              lVar20 = 0xe0;
              do {
                if ((long *)(local_1a78 + lVar20) != *(long **)((long)local_1a88 + lVar20)) {
                  operator_delete(*(long **)((long)local_1a88 + lVar20),
                                  *(long *)(local_1a78 + lVar20) + 1);
                }
                lVar20 = lVar20 + -0x20;
              } while (lVar20 != 0xa0);
              if ((undefined1 *)local_19e8._0_8_ != local_19e8 + 0x10) {
                operator_delete((void *)local_19e8._0_8_,local_19e8._16_8_ + 1);
              }
              lVar20 = 0x50;
              do {
                if ((long *)(local_1a78 + lVar20) != *(long **)((long)local_1a88 + lVar20)) {
                  operator_delete(*(long **)((long)local_1a88 + lVar20),
                                  *(long *)(local_1a78 + lVar20) + 1);
                }
                lVar20 = lVar20 + -0x20;
              } while (lVar20 != 0x10);
              if ((undefined1 *)local_1a78._0_8_ != local_1a78 + 0x10) {
                operator_delete((void *)local_1a78._0_8_,local_1a78._16_8_ + 1);
              }
            }
          }
          uVar23 = *(uint *)((long)local_1838 + lVar16 * 4);
          uVar18 = uVar23 ^ uVar19;
          *(uint *)((long)local_1838 + lVar16 * 4) = uVar18;
        } while (uVar23 != uVar19);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x200);
    if (bVar3) {
      poVar15 = operator<<((ostream *)&std::cout,&local_1958.first);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      poVar15 = (ostream *)std::ostream::flush();
      poVar15 = operator<<(poVar15,&local_1958.second);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
    else {
      poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
    }
    std::ostream::put((char)poVar15);
    std::ostream::flush();
    lVar16 = 0xe0;
    do {
      plVar12 = (long *)((long)&(((recordType *)(local_1958.first.station + -1))->trainID).
                                _M_dataplus._M_p + lVar16);
      if (plVar12 != *(long **)((long)local_1968 + lVar16)) {
        operator_delete(*(long **)((long)local_1968 + lVar16),*plVar12 + 1);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0xa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1958.second.trainID._M_dataplus._M_p != &local_1958.second.trainID.field_2) {
      operator_delete(local_1958.second.trainID._M_dataplus._M_p,
                      local_1958.second.trainID.field_2._M_allocated_capacity + 1);
    }
    lVar16 = 0x50;
    do {
      plVar12 = (long *)((long)&(((recordType *)(local_1958.first.station + -1))->trainID).
                                _M_dataplus._M_p + lVar16);
      if (plVar12 != *(long **)((long)local_1968 + lVar16)) {
        operator_delete(*(long **)((long)local_1968 + lVar16),*plVar12 + 1);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1958.first.trainID._M_dataplus._M_p != &local_1958.first.trainID.field_2) {
      operator_delete(local_1958.first.trainID._M_dataplus._M_p,
                      local_1958.first.trainID.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void query_transfer_cmp(std::string station[] , timeType date , Compare comp)
		{
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[3][WS];		
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				std::pair<recordType , recordType> ans;bool found = false;
				for (int i = 0;i < WS;++ i)
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						locType offset = (i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType);
						trainType *train = TrainFile -> read(offset);
						int day_id = timeType::dateminus(date , train -> saleDate[0]) + train -> get_Delta_date(station[0]);
						if (train -> is_released == false || day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0])) continue;
						std::pair<recordType , recordType> cur;
						cur.first.trainID = train -> trainID , cur.first.station[0] = station[0] , cur.first.time[0] = cur.first.time[1] = train -> startTime;
						cur.first.seat = 100000 , cur.first.price = 0 , cur.first.duration = 0;
						bool flag = false;
						for (int j = 0 , stationNum = train -> stationNum;j < train -> stationNum;++ j)
						{
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].travelTime , cur.first.duration += flag * (train -> stations[j].travelTime);
							if (flag)
							{
								cur.first.station[1] = train -> stations[j].stationName;
								cur.first.seat = min(cur.first.seat , train -> stations[j].seatNum[day_id]) , cur.first.price += train -> stations[j].price;
								bitset_query(StationBpTree -> find(hasher(train -> stations[j].stationName)).first , bits[2]);
								for (int k = 0;k < WS;++ k)
								{
									bits[2][k] &= bits[1][k];
									for (unsigned int v;bits[2][k];bits[2][k] ^= v)
									{
										v = bits[2][k] & (-bits[2][k]);
										if (!v) continue;
										int id_ = -1;
										for (unsigned int v_ = v;v_;v_ >>= 1) ++ id_;
										trainType *train_ = TrainFile -> read((k * W + id_ + 1) * sizeof (DynamicFileManager<trainType>::valueType));
										if (train_ -> trainID == cur.first.trainID) continue;
										cur.second.station[0] = cur.first.station[1] , cur.second.station[1] = station[1];
										cur.second.trainID = train_ -> trainID , cur.second.time[0] = cur.first.time[1];
										if (train_ -> getrecord(&cur.second , true)) if (!found || comp(cur , ans)) ans = cur , found = true;
									}
								}
							}
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].stopoverTime , cur.first.duration += flag * (train -> stations[j].stopoverTime);
							if (train -> stations[j].stationName == station[0])
							{
								flag = true;
								cur.first.time[1].month = cur.first.time[0].month = date.month;
								cur.first.time[0].hour = cur.first.time[1].hour , cur.first.time[0].minute = cur.first.time[1].minute;
								cur.first.time[1].day = cur.first.time[0].day = date.day;
							}
						}
					}
				if (!found) std::cout << 0 << std::endl;
				else std::cout << ans.first << std::endl << ans.second << std::endl;
			}
		}